

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  char *pcVar5;
  string stripArgs;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar3 != STATIC_LIBRARY) && (this->ImportLibrary == false)) {
    pcVar1 = this->Target->Target->Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"APPLE",&local_72);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    if (bVar2) {
      this_00 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"MACOSX_BUNDLE",&local_71);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        return;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
    }
    pcVar1 = this->Target->Target->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_STRIP",(allocator<char> *)&local_50);
    bVar2 = cmMakefile::IsSet(pcVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      pcVar1 = this->Target->Target->Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"APPLE",&local_72);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if ((bVar2) &&
         (((TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == SHARED_LIBRARY ||
           (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY)) ||
          (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == EXECUTABLE)))) {
        std::__cxx11::string::assign((char *)&local_70);
      }
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar4,"if(CMAKE_INSTALL_DO_STRIP)\n");
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar4 = std::operator<<(poVar4,"  execute_process(COMMAND \"");
      pcVar1 = this->Target->Target->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CMAKE_STRIP",&local_72);
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_50);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\" ");
      poVar4 = std::operator<<(poVar4,(string *)&local_70);
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
      std::operator<<(poVar4,"\")\n");
      std::__cxx11::string::~string((string *)&local_50);
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar4,"endif()\n");
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddStripRule(std::ostream& os, Indent indent,
                                            const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->ImportLibrary) {
    return;
  }

  // Don't handle OSX Bundles.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE") &&
      this->Target->GetPropertyAsBool("MACOSX_BUNDLE")) {
    return;
  }

  if (!this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP")) {
    return;
  }

  std::string stripArgs;

  // macOS 'strip' is picky, executables need '-u -r' and dylibs need '-x'.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
      stripArgs = "-x ";
    } else if (this->Target->GetType() == cmStateEnums::EXECUTABLE) {
      stripArgs = "-u -r ";
    }
  }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetDefinition("CMAKE_STRIP")
     << "\" " << stripArgs << "\"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}